

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O3

bool Diligent::VerifyDynamicBufferOffset<Diligent::BufferVkImpl,Diligent::BufferViewVkImpl>
               (PipelineResourceDesc *ResDesc,IDeviceObject *pObject,Uint64 BufferBaseOffset,
               Uint64 BufferRangeSize,Uint64 BufferDynamicOffset)

{
  SHADER_RESOURCE_TYPE SVar1;
  uint uVar2;
  RenderDeviceVkImpl *pRVar3;
  char (*Args_1) [65];
  char (*Args_1_00) [21];
  char (*Args_2) [67];
  char (*Args_1_01) [62];
  DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc> *this;
  bool bVar4;
  char (*in_stack_ffffffffffffff88) [3];
  string msg;
  Uint64 BufferDynamicOffset_local;
  Uint32 OffsetAlignment;
  undefined4 uStack_3c;
  char *local_38;
  
  bVar4 = (ResDesc->Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) ==
          PIPELINE_RESOURCE_FLAG_NONE;
  Args_1 = (char (*) [65])BufferRangeSize;
  Args_2 = (char (*) [67])BufferDynamicOffset;
  BufferDynamicOffset_local = BufferDynamicOffset;
  if (!bVar4) {
    FormatString<char[51],char_const*,char[81]>
              (&msg,(Diligent *)"Error setting dynamic buffer offset for variable \'",
               (char (*) [51])ResDesc,
               (char **)
               "\': the variable was created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.",
               (char (*) [81])BufferDynamicOffset);
    Args_1 = (char (*) [65])0x221;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  SVar1 = ResDesc->ResourceType;
  if ((SVar1 == SHADER_RESOURCE_TYPE_BUFFER_UAV) || (SVar1 == SHADER_RESOURCE_TYPE_BUFFER_SRV)) {
    if (pObject == (IDeviceObject *)0x0) {
      return bVar4;
    }
    CheckDynamicType<Diligent::BufferViewVkImpl_const,Diligent::IDeviceObject_const>(pObject);
    this = (DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            *)pObject[9].super_IObject._vptr_IObject;
    if (this != (DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 *)0x0) {
      CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IBuffer>((IBuffer *)this);
    }
    if ((BufferBaseOffset != 0) &&
       (pObject[5].super_IObject._vptr_IObject != (_func_int **)BufferBaseOffset)) {
      FormatString<char[26],char[65]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BufferBaseOffset == 0 || BufferBaseOffset == ViewDesc.ByteOffset",
                 Args_1);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x233);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    Args_1_01 = (char (*) [62])pObject[6].super_IObject._vptr_IObject;
    if (Args_1_01 != (char (*) [62])BufferRangeSize && BufferRangeSize != 0) {
      FormatString<char[26],char[62]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"BufferRangeSize == 0 || BufferRangeSize == ViewDesc.ByteWidth",
                 Args_1_01);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x234);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      Args_1_01 = (char (*) [62])pObject[6].super_IObject._vptr_IObject;
    }
    if (this == (DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 *)0x0) {
      return bVar4;
    }
    BufferBaseOffset = (Uint64)pObject[5].super_IObject._vptr_IObject;
  }
  else {
    if (SVar1 != SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) {
      FormatString<char[51],char_const*,char[67]>
                (&msg,(Diligent *)"Error setting dynamic buffer offset for variable \'",
                 (char (*) [51])ResDesc,
                 (char **)"\': the offset may only be set for constant and structured buffers.",
                 Args_2);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x23b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p == &msg.field_2) {
        return bVar4;
      }
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      return bVar4;
    }
    if (pObject == (IDeviceObject *)0x0) {
      return bVar4;
    }
    CheckDynamicType<Diligent::BufferVkImpl_const,Diligent::IDeviceObject_const>(pObject);
    Args_1_01 = (char (*) [62])BufferRangeSize;
    this = (DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
            *)pObject;
  }
  if ((char *)(this->m_Desc).Size < *Args_1_01 + BufferBaseOffset + BufferDynamicOffset) {
    _OffsetAlignment = BufferBaseOffset + BufferDynamicOffset;
    local_38 = *Args_1_01 + BufferBaseOffset + BufferDynamicOffset;
    FormatString<char[16],unsigned_long,char[26],char_const*,char[25],unsigned_long,char[3],unsigned_long,char[38],char_const*,char[11],unsigned_long,char[2]>
              (&msg,(Diligent *)"Dynamic offset ",(char (*) [16])&BufferDynamicOffset_local,
               (unsigned_long *)0x6c18ee,(char (*) [26])ResDesc,(char **)"\' defines buffer range ["
               ,(char (*) [25])&OffsetAlignment,(unsigned_long *)0x7b1039,(char (*) [3])&local_38,
               (unsigned_long *)") that is past the bounds of buffer \'",
               (char (*) [38])&this->m_Desc,(char **)"\' of size ",
               (char (*) [11])&(this->m_Desc).Size,(unsigned_long *)0x75a69e,
               (char (*) [2])in_stack_ffffffffffffff88);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x246);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  pRVar3 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
           ::GetDevice(this);
  Args_1_00 = (char (*) [21])(ulong)(ResDesc->ResourceType != SHADER_RESOURCE_TYPE_CONSTANT_BUFFER);
  uVar2 = *(uint *)((pRVar3->
                    super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                    ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.ShadingRate
                    .ShadingRates + (long)Args_1_00 * 2 + -0x1e);
  OffsetAlignment = uVar2;
  if ((ulong)uVar2 == 0) {
    FormatString<char[26],char[21]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x750f16,Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x24f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (BufferDynamicOffset_local % (ulong)uVar2 != 0) {
    FormatString<char[17],unsigned_long,char[27],char_const*,char[51],unsigned_int,char[3]>
              (&msg,(Diligent *)"Dynamic offset (",(char (*) [17])&BufferDynamicOffset_local,
               (unsigned_long *)") specified for variable \'",(char (*) [27])ResDesc,
               (char **)"\' is not a multiple of required offset alignment (",
               (char (*) [51])&OffsetAlignment,(uint *)0x75ce90,in_stack_ffffffffffffff88);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDynamicBufferOffset",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0x254);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool VerifyDynamicBufferOffset(const PipelineResourceDesc& ResDesc,
                               const IDeviceObject*        pObject,
                               Uint64                      BufferBaseOffset,
                               Uint64                      BufferRangeSize,
                               Uint64                      BufferDynamicOffset)
{
    bool BindingOK = true;

    if ((ResDesc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != 0)
    {
        RESOURCE_VALIDATION_FAILURE("Error setting dynamic buffer offset for variable '", ResDesc.Name, "': the variable was created with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.");
        BindingOK = false;
    }

    const BufferImplType* pBuffer = nullptr;
    switch (ResDesc.ResourceType)
    {
        case SHADER_RESOURCE_TYPE_CONSTANT_BUFFER:
            pBuffer = ClassPtrCast<const BufferImplType>(pObject);
            break;

        case SHADER_RESOURCE_TYPE_BUFFER_SRV:
        case SHADER_RESOURCE_TYPE_BUFFER_UAV:
            if (const BufferViewImplType* pBuffView = ClassPtrCast<const BufferViewImplType>(pObject))
            {
                pBuffer = pObject != nullptr ? pBuffView->template GetBuffer<const BufferImplType>() : nullptr;

                const BufferViewDesc& ViewDesc = pBuffView->GetDesc();
                VERIFY_EXPR(BufferBaseOffset == 0 || BufferBaseOffset == ViewDesc.ByteOffset);
                VERIFY_EXPR(BufferRangeSize == 0 || BufferRangeSize == ViewDesc.ByteWidth);
                BufferBaseOffset = ViewDesc.ByteOffset;
                BufferRangeSize  = ViewDesc.ByteWidth;
            }
            break;

        default:
            RESOURCE_VALIDATION_FAILURE("Error setting dynamic buffer offset for variable '", ResDesc.Name, "': the offset may only be set for constant and structured buffers.");
    }

    if (pBuffer != nullptr)
    {
        const BufferDesc& BuffDesc = pBuffer->GetDesc();
        if (BufferBaseOffset + BufferRangeSize + BufferDynamicOffset > BuffDesc.Size)
        {
            RESOURCE_VALIDATION_FAILURE("Dynamic offset ", BufferDynamicOffset, " specified for variable '", ResDesc.Name,
                                        "' defines buffer range [", BufferBaseOffset + BufferDynamicOffset, ", ",
                                        BufferBaseOffset + BufferRangeSize + BufferDynamicOffset,
                                        ") that is past the bounds of buffer '", BuffDesc.Name, "' of size ", BuffDesc.Size, ".");
            BindingOK = false;
        }

        const BufferProperties& BufferProps = pBuffer->GetDevice()->GetAdapterInfo().Buffer;

        const Uint32 OffsetAlignment = (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_CONSTANT_BUFFER) ?
            BufferProps.ConstantBufferOffsetAlignment :
            BufferProps.StructuredBufferOffsetAlignment;
        VERIFY_EXPR(OffsetAlignment != 0);

        if ((BufferDynamicOffset % OffsetAlignment) != 0)
        {
            RESOURCE_VALIDATION_FAILURE("Dynamic offset (", BufferDynamicOffset, ") specified for variable '", ResDesc.Name,
                                        "' is not a multiple of required offset alignment (", OffsetAlignment, ").");
            BindingOK = false;
        }
    }

    return BindingOK;
}